

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O3

void __thiscall ShellLinkAndJumpListHandler::parseFile(ShellLinkAndJumpListHandler *this)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined1 *__src;
  undefined1 *puVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  undefined1 *puVar8;
  undefined7 extraout_var;
  ostream *poVar9;
  long *plVar10;
  undefined1 *puVar11;
  ptrdiff_t _Num;
  pointer __n;
  pointer puVar12;
  long local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ulong local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  uVar7 = this->startPosition;
  local_90 = 0;
  local_50 = 0;
  puVar8 = (undefined1 *)0x0;
  do {
    lVar3 = local_90;
    ReadStream::read((ReadStream *)&local_48,(int)this->rs,(void *)(ulong)uVar7,4);
    lVar5 = local_38;
    puVar4 = puStack_40;
    __src = local_48;
    local_90 = local_38;
    local_48 = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x0;
    local_38 = 0;
    if ((puVar8 != (undefined1 *)0x0) &&
       (operator_delete(puVar8,lVar3 - (long)puVar8), local_48 != (undefined1 *)0x0)) {
      operator_delete(local_48,local_38 - (long)local_48);
    }
    puVar8 = puVar4 + -1;
    puVar2 = __src;
    if (__src < puVar8 && __src != puVar4) {
      do {
        puVar11 = puVar2 + 1;
        uVar1 = *puVar2;
        *puVar2 = *puVar8;
        *puVar8 = uVar1;
        puVar8 = puVar8 + -1;
        puVar2 = puVar11;
      } while (puVar11 < puVar8);
    }
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = puVar4 + -(long)__src;
    if (__n == (pointer)0x0) {
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      puVar12 = (pointer)0x0;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      if ((long)__n < 0) {
        std::__throw_bad_alloc();
      }
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new((ulong)__n);
      puVar12 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + (long)__n;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar12;
      memmove(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,__src,(size_t)__n);
    }
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar12;
    uVar7 = Utils::lenFourBytesChar(&local_68);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar7 == 0x4c) {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar4 == __src) {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __n;
      }
      else {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new((ulong)__n);
        puVar12 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + (long)__n;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar12;
        memmove(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,__src,(size_t)__n);
        __n = puVar12;
      }
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __n;
      parseLNKStruct(this,&local_88);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((((local_50 & 1) == 0) && (uVar7 < 5)) && ((0x1aU >> (uVar7 & 0x1f) & 1) != 0)) {
      bVar6 = parseJumpListStruct(this);
      local_50 = CONCAT71(extraout_var,bVar6);
    }
    uVar7 = this->startPosition + 4;
    this->startPosition = uVar7;
    puVar8 = __src;
  } while (puVar4 != __src);
  if ((local_50 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DestList structure not found.",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"This may be because not all LNK structures are found, ",0x36);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"or because the DestList is not located after the LNK stream, ",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"or because file doesn\'t contain DestList at all.",0x30);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    plVar10 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    plVar10 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The total number of Shell Link = ",0x21);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->countOfShellLink);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The number of Shell Link with errors while parsing = ",0x35);
  *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->countOfShellLinkWithErrors)
  ;
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  if (__src != (undefined1 *)0x0) {
    operator_delete(__src,lVar5 - (long)__src);
  }
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseFile() {
    bool isDestListStructFound = false;
    std::vector<unsigned char> headerValue;
    do {
        headerValue =  rs->read(startPosition,4);

        reverse(headerValue.begin(), headerValue.end());
        unsigned int hValue = Utils::lenFourBytesChar(headerValue);

        if(hValue == 0x0000004c) { /* Decode ShellLink Stream = CustDest Jump List */
            ShellLinkAndJumpListHandler::parseLNKStruct(headerValue);
        }
        /* 0x00000004 - Windows 10
         * 0x00000003 - Windows 10
         * 0x00000001 - Windows 7
         * 0x00000001 - Windows 8 */
        if(!isDestListStructFound && (hValue == 0x00000001 || hValue == 0x00000003 || hValue == 0x00000004))
            isDestListStructFound = ShellLinkAndJumpListHandler::parseJumpListStruct();

        startPosition += 4;
    } while(headerValue.size() != 0);

    if(!isDestListStructFound)
        cout << "DestList structure not found." << endl
        << "This may be because not all LNK structures are found, " << endl <<
           "or because the DestList is not located after the LNK stream, " <<
           "or because file doesn't contain DestList at all." << endl << endl << endl;
    cout << "The total number of Shell Link = " << dec << countOfShellLink << endl;
    cout << "The number of Shell Link with errors while parsing = " << dec << countOfShellLinkWithErrors << endl;
}